

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqFactoring.cpp
# Opt level: O1

ClauseIterator __thiscall
Inferences::ALASCA::EqFactoring::generateClauses(EqFactoring *this,Clause *premise)

{
  long *plVar1;
  long *plVar2;
  SelectedEquality *pSVar3;
  SelectedEquality *pSVar4;
  bool bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar6;
  _func_int **pp_Var7;
  Clause *in_RDX;
  anon_class_16_2_f84bbffd f;
  anon_class_16_2_f84bbffd f_00;
  anon_class_16_2_f84bbffd f_01;
  anon_class_16_2_f84bbffd f_02;
  anon_class_16_2_f84bbffd f_03;
  anon_class_16_2_f84bbffd f_04;
  _ElementType out;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> rest;
  shared_ptr<Lib::Stack<Kernel::SelectedEquality>_> selected;
  undefined1 local_6e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6e0;
  char local_6d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_6d0;
  Clause *local_6c8;
  char acStack_6c0 [24];
  Stack<Kernel::SelectedEquality> local_6a8;
  Stack<Kernel::SelectedEquality> local_688;
  EqFactoring *local_660;
  Clause *local_658;
  undefined8 local_650;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_648;
  undefined8 uStack_640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  Clause *local_630;
  element_type *local_628;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_620;
  element_type *local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_610;
  ulong local_608 [6];
  undefined4 local_5d8;
  Clause *local_5c8;
  undefined1 local_5c0 [64];
  undefined1 local_580 [56];
  Value local_548 [9];
  OptionBase<Kernel::SelectedEquality> local_500;
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>
  local_4b8;
  undefined1 local_3f0 [16];
  element_type *local_3e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  Clause *local_3d0;
  Clause *local_3c8;
  unsigned_long uStack_3c0;
  element_type *local_3b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  undefined1 local_378;
  undefined8 local_370;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
  local_2e8;
  undefined1 local_230 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  Value local_1b8;
  Value local_1b0 [15];
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
  local_138;
  
  local_660 = this;
  local_658 = premise;
  local_5c8 = in_RDX;
  Kernel::AlascaState::selectedEqualities
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
              *)&local_2e8,*(AlascaState **)&(premise->super_Unit)._inference.field_0x8,in_RDX,
             NOT_LESS,NOT_LEQ,false);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)&local_4b8,&local_2e8);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_5c0,
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)&local_4b8);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)(local_3f0 + 8),
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_5c0);
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = (Value)0x0;
  uStack_328 = 0;
  local_300 = 0;
  if (((bool)local_580[0x30] == true) &&
     (plVar2 = (long *)CONCAT71(local_548[0]._1_7_,local_548[0]._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._56_8_);
  }
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_5c0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_3f0);
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_230,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_5c0);
  if ((local_548[0]._0_1_ == '\x01') && (local_548[1] != (Value)0x0)) {
    plVar2 = (long *)((long)local_548[1] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_548[1] + 8))();
    }
  }
  if ((AlascaState *)local_580._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._0_8_);
  }
  if (((bool)local_378 == true) && ((Value)local_370 != (Value)0x0)) {
    plVar2 = (long *)(local_370 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  if ((local_4b8._master._inner._next.super_OptionBase<unsigned_long>._isSome == true) &&
     (local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem._elem.init != (Value)0x0)
     ) {
    plVar2 = (long *)((long)local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem.
                            _elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem.
                            _elem + 8))();
    }
  }
  if (local_4b8._master._inner._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b8._master._inner._func.selected.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_3f0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_230);
  local_688._capacity = 0;
  local_688._stack = (SelectedEquality *)0x0;
  local_688._cursor = (SelectedEquality *)0x0;
  local_688._end = (SelectedEquality *)0x0;
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_5c0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                      *)local_3f0);
  bVar5 = ::Lib::
          FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
          ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                     *)local_5c0);
  if (bVar5) {
    do {
      ::Lib::
      FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
      ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                 *)local_5c0);
      p_Stack_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6c8 = (Clause *)0x0;
      acStack_6c0[0] = '\0';
      acStack_6c0[1] = '\0';
      acStack_6c0[2] = '\0';
      acStack_6c0[3] = '\0';
      acStack_6c0[4] = '\0';
      acStack_6c0[5] = '\0';
      acStack_6c0[6] = '\0';
      acStack_6c0[7] = '\0';
      local_6d8[0] = '\0';
      local_6d8[1] = '\0';
      local_6d8[2] = '\0';
      local_6d8[3] = '\0';
      local_6d8[4] = '\0';
      local_6d8[5] = '\0';
      local_6d8[6] = '\0';
      local_6d8[7] = '\0';
      p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      acStack_6c0[8] = '\0';
      acStack_6c0[9] = 0;
      acStack_6c0[10] = 0;
      acStack_6c0[0xb] = 0;
      local_6e8 = (undefined1  [8])((ulong)(byte)local_500._elem._elem._0_1_ & 0xffffffffffffff03);
      f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                 *)&local_500._elem;
      f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                *)local_6e8;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_6e8,f);
      local_4b8._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4b8._master._func.this = (EqFactoring *)0x0;
      local_4b8._master._func.i = 0;
      local_4b8._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4b8._master._inner._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ::Lib::OptionBase<Kernel::SelectedEquality>::operator=
                (&local_500,(OptionBase<Kernel::SelectedEquality> *)&local_4b8);
      local_608[1] = 0;
      local_608[2] = 0;
      local_608[3] = 0;
      local_608[4] = 0;
      local_608[5] = 0;
      local_5d8 = 0;
      local_608[0] = (ulong)local_6e8 & 3;
      f_00.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                    *)local_6e8;
      f_00.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_608;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_608,f_00);
      if (local_688._cursor == local_688._end) {
        ::Lib::Stack<Kernel::SelectedEquality>::expand(&local_688);
      }
      *(undefined8 *)((long)local_688._cursor + 0x20) = 0;
      *(undefined8 *)((long)local_688._cursor + 0x28) = 0;
      *(undefined8 *)((long)local_688._cursor + 0x10) = 0;
      *(undefined8 *)((long)local_688._cursor + 0x18) = 0;
      *(undefined8 *)local_688._cursor = 0;
      *(undefined8 *)((long)local_688._cursor + 8) = 0;
      *(undefined4 *)((long)local_688._cursor + 0x30) = 0;
      *(byte *)local_688._cursor = (byte)local_608[0]._0_1_ & 3;
      f_01.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                    *)local_608;
      f_01.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_688._cursor;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_688._cursor,f_01);
      local_688._cursor = (SelectedEquality *)((long)local_688._cursor + 0x34);
      bVar5 = ::Lib::
              FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:155:17),_false>
              ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:155:17),_false>
                         *)local_5c0);
    } while (bVar5);
  }
  if ((local_548[0]._0_1_ == '\x01') && (local_548[1] != (Value)0x0)) {
    plVar2 = (long *)((long)local_548[1] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_548[1] + 8))();
    }
  }
  if ((AlascaState *)local_580._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._0_8_);
  }
  if (((bool)local_378 == true) && ((Value)local_370 != (Value)0x0)) {
    plVar2 = (long *)(local_370 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  ::Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>((Lib *)&local_618,&local_688);
  if (local_688._stack != (SelectedEquality *)0x0) {
    uVar6 = local_688._capacity * 0x34 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_688._stack;
    }
    else if (uVar6 < 0x11) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_688._stack;
    }
    else if (uVar6 < 0x19) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_688._stack;
    }
    else if (uVar6 < 0x21) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_688._stack;
    }
    else if (uVar6 < 0x31) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_688._stack;
    }
    else if (uVar6 < 0x41) {
      *(undefined8 *)
       &((local_688._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_688._stack;
    }
    else {
      operator_delete(local_688._stack,0x10);
    }
  }
  if (((bool)local_1b8.init._0_1_ == true) && (local_1b0[0] != (Value)0x0)) {
    plVar2 = (long *)((long)local_1b0[0] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1b0[0] + 8))();
    }
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  if ((local_2e8._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_2e8._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2e8._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2e8._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Kernel::AlascaState::selectedEqualities
            ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>_>
              *)&local_2e8,*(AlascaState **)&(local_658->super_Unit)._inference.field_0x8,local_5c8,
             ANY,NOT_LEQ,false);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)&local_4b8,&local_2e8);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_5c0,
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)&local_4b8);
  ::Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>
  ::FilterMapIter((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)(local_3f0 + 8),
                  (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>
                   *)local_5c0);
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = (Value)0x0;
  uStack_328 = 0;
  local_300 = 0;
  if (((bool)local_580[0x30] == true) &&
     (plVar2 = (long *)CONCAT71(local_548[0]._1_7_,local_548[0]._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._56_8_);
  }
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_5c0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_3f0);
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_230,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_5c0);
  if ((local_548[0]._0_1_ == '\x01') && (local_548[1] != (Value)0x0)) {
    plVar2 = (long *)((long)local_548[1] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_548[1] + 8))();
    }
  }
  if ((AlascaState *)local_580._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._0_8_);
  }
  if (((bool)local_378 == true) && ((Value)local_370 != (Value)0x0)) {
    plVar2 = (long *)(local_370 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  if ((local_4b8._master._inner._next.super_OptionBase<unsigned_long>._isSome == true) &&
     (local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem._elem.init != (Value)0x0)
     ) {
    plVar2 = (long *)((long)local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem.
                            _elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_4b8._master._inner._next.super_OptionBase<unsigned_long>._elem.
                            _elem + 8))();
    }
  }
  if (local_4b8._master._inner._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4b8._master._inner._func.selected.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_3f0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_230);
  local_6a8._capacity = 0;
  local_6a8._stack = (SelectedEquality *)0x0;
  local_6a8._cursor = (SelectedEquality *)0x0;
  local_6a8._end = (SelectedEquality *)0x0;
  ::Lib::
  FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
  ::FilteredIterator((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_5c0,
                     (FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                      *)local_3f0);
  bVar5 = ::Lib::
          FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
          ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                     *)local_5c0);
  if (bVar5) {
    do {
      ::Lib::
      FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
      ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                 *)local_5c0);
      p_Stack_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6c8 = (Clause *)0x0;
      acStack_6c0[0] = '\0';
      acStack_6c0[1] = '\0';
      acStack_6c0[2] = '\0';
      acStack_6c0[3] = '\0';
      acStack_6c0[4] = '\0';
      acStack_6c0[5] = '\0';
      acStack_6c0[6] = '\0';
      acStack_6c0[7] = '\0';
      local_6d8[0] = '\0';
      local_6d8[1] = '\0';
      local_6d8[2] = '\0';
      local_6d8[3] = '\0';
      local_6d8[4] = '\0';
      local_6d8[5] = '\0';
      local_6d8[6] = '\0';
      local_6d8[7] = '\0';
      p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      acStack_6c0[8] = '\0';
      acStack_6c0[9] = 0;
      acStack_6c0[10] = 0;
      acStack_6c0[0xb] = 0;
      local_6e8 = (undefined1  [8])((ulong)(byte)local_500._elem._elem._0_1_ & 0xffffffffffffff03);
      f_02.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                    *)&local_500._elem;
      f_02.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_6e8;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_6e8,f_02);
      local_4b8._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4b8._master._func.this = (EqFactoring *)0x0;
      local_4b8._master._func.i = 0;
      local_4b8._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4b8._master._inner._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ::Lib::OptionBase<Kernel::SelectedEquality>::operator=
                (&local_500,(OptionBase<Kernel::SelectedEquality> *)&local_4b8);
      local_608[1] = 0;
      local_608[2] = 0;
      local_608[3] = 0;
      local_608[4] = 0;
      local_608[5] = 0;
      local_5d8 = 0;
      local_608[0] = (ulong)local_6e8 & 3;
      f_03.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                    *)local_6e8;
      f_03.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_608;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_608,f_03);
      if (local_6a8._cursor == local_6a8._end) {
        ::Lib::Stack<Kernel::SelectedEquality>::expand(&local_6a8);
      }
      *(undefined8 *)((long)local_6a8._cursor + 0x20) = 0;
      *(undefined8 *)((long)local_6a8._cursor + 0x28) = 0;
      *(undefined8 *)((long)local_6a8._cursor + 0x10) = 0;
      *(undefined8 *)((long)local_6a8._cursor + 0x18) = 0;
      *(undefined8 *)local_6a8._cursor = 0;
      *(undefined8 *)((long)local_6a8._cursor + 8) = 0;
      *(undefined4 *)((long)local_6a8._cursor + 0x30) = 0;
      *(byte *)local_6a8._cursor = (byte)local_608[0]._0_1_ & 3;
      f_04.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                    *)local_608;
      f_04.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                   *)local_6a8._cursor;
      ::Lib::CoproductImpl::
      RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>>>&&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                  *)local_6a8._cursor,f_04);
      local_6a8._cursor = (SelectedEquality *)((long)local_6a8._cursor + 0x34);
      bVar5 = ::Lib::
              FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:256:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:164:17),_false>
              ::hasNext((FilteredIterator<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:256:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:164:17),_false>
                         *)local_5c0);
    } while (bVar5);
  }
  if ((local_548[0]._0_1_ == '\x01') && (local_548[1] != (Value)0x0)) {
    plVar2 = (long *)((long)local_548[1] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_548[1] + 8))();
    }
  }
  if ((AlascaState *)local_580._0_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._0_8_);
  }
  if (((bool)local_378 == true) && ((Value)local_370 != (Value)0x0)) {
    plVar2 = (long *)(local_370 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  ::Lib::make_shared<Lib::Stack<Kernel::SelectedEquality>,_true>((Lib *)&local_628,&local_6a8);
  if (local_6a8._stack != (SelectedEquality *)0x0) {
    uVar6 = local_6a8._capacity * 0x34 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_6a8._stack;
    }
    else if (uVar6 < 0x11) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_6a8._stack;
    }
    else if (uVar6 < 0x19) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_6a8._stack;
    }
    else if (uVar6 < 0x21) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_6a8._stack;
    }
    else if (uVar6 < 0x31) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_6a8._stack;
    }
    else if (uVar6 < 0x41) {
      *(undefined8 *)
       &((local_6a8._stack)->_inner)._inner.
        super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
        .
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
        .
        super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_6a8._stack;
    }
    else {
      operator_delete(local_6a8._stack,0x10);
    }
  }
  if (((bool)local_1b8.init._0_1_ == true) && (local_1b0[0] != (Value)0x0)) {
    plVar2 = (long *)((long)local_1b0[0] + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1b0[0] + 8))();
    }
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  if ((local_2e8._inn._current.
       super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
       ._isSome == true) &&
     (local_2e8._inn._current.
      super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2e8._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2e8._inn._current.
                            super_OptionBase<Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
      super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
               super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pSVar3 = local_618->_cursor;
  pSVar4 = local_618->_stack;
  local_608[0] = 0;
  local_608[1] = 0;
  if (local_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_610->_M_use_count = local_610->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_610->_M_use_count = local_610->_M_use_count + 1;
    }
  }
  local_5c0._56_8_ = ((long)pSVar3 - (long)pSVar4 >> 2) * 0x4ec4ec4ec4ec4ec5;
  if (local_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_620->_M_use_count = local_620->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_620->_M_use_count = local_620->_M_use_count + 1;
    }
  }
  local_630 = local_658;
  local_2e8._inn._master._inner._inner._func.sel = NOT_LEQ;
  local_2e8._inn._master._inner._inner._func._4_4_ = 0;
  local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_648 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_640 = 0;
  local_650 = 0;
  local_638 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6c8 = local_658;
  local_6e8 = (undefined1  [8])0x0;
  p_Stack_6e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_6d8[0] = '\0';
  local_6d8[1] = '\0';
  local_6d8[2] = '\0';
  local_6d8[3] = '\0';
  local_6d8[4] = '\0';
  local_6d8[5] = '\0';
  local_6d8[6] = '\0';
  local_6d8[7] = '\0';
  p_Stack_6d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e8._inn._master._inner._func.cl = local_658;
  local_2e8._inn._master._func.this = (AlascaState *)0x0;
  local_5c0._0_8_ = (element_type *)0x0;
  local_2e8._0_8_ = 0;
  local_2e8._inn._master._inner._func.this = (AlascaState *)0x0;
  local_5c0._16_8_ = (element_type *)0x0;
  local_2e8._inn._master._func.includeUnshieldedNumberVariables = false;
  local_2e8._inn._master._func._9_3_ = 0;
  local_2e8._inn._master._func.selSum = NOT_LEQ;
  local_5c0._32_8_ = local_658;
  local_5c0._40_8_ = (Clause *)0x0;
  local_5c0._48_8_ = (element_type *)0x0;
  local_3f0._0_8_ = local_618;
  local_5c0._8_8_ = (AlascaState *)0x0;
  local_3f0._8_8_ = local_610;
  local_3e0 = local_628;
  local_5c0._24_8_ = (AlascaState *)0x0;
  local_3d8._M_pi = local_620;
  local_3d0 = local_658;
  local_3c8 = (Clause *)0x0;
  uStack_3c0 = 0;
  local_3b8 = (element_type *)local_5c0._56_8_;
  local_2e8._inn._master._inner._inner._func.cmp.cmpCache.
  super___shared_ptr<Lib::Map<std::pair<unsigned_int,_unsigned_int>,_Kernel::Ordering::Result,_Lib::DefaultHash>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._56_8_;
  if ((element_type *)local_5c0._56_8_ == (element_type *)0x0) {
    memset((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
            *)&local_3b0,0,200);
  }
  else {
    ::Lib::
    MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
    ::next((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>
            *)&local_4b8,
           (MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
            *)local_3f0);
    ::Lib::
    FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>
    ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>
                  *)local_230,&local_4b8);
    ::Lib::
    Option<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>
    ::operator()((Option<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>
                  *)&local_3b0,
                 (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>
                  *)local_230);
    ::Lib::
    OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
    ::~OptionBase((OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
                   *)&local_1b0[0].init);
    if ((Clause *)local_1e0._M_pi != (Clause *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
    }
    if ((element_type *)local_1f8._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
    }
    if ((AlascaState *)local_210._M_pi != (AlascaState *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._8_8_);
    }
    ::Lib::
    OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
    ::~OptionBase(&local_4b8._current.
                   super_OptionBase<Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>
                 );
    if (local_4b8._master._inner._func.rest.
        super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4b8._master._inner._func.rest.
                 super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_4b8._master._inner._func.selected.
        super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4b8._master._inner._func.selected.
                 super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_4b8._master._func.rest.
        super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4b8._master._func.rest.
                 super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_4b8._master._func.selected.
        super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_4b8._master._func.selected.
                 super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)local_5c0,
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_3f0);
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)&local_138,
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_5c0);
  ::Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)local_580);
  if ((AlascaState *)local_5c0._24_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._24_8_);
  }
  if ((AlascaState *)local_5c0._8_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._8_8_);
  }
  ::Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)&local_3b0);
  if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_);
  }
  if (p_Stack_6d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6d0);
  }
  if (p_Stack_6e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_6e0);
  }
  pp_Var7 = (_func_int **)::operator_new(0x118,8);
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)local_5c0,&local_138);
  *(undefined4 *)(pp_Var7 + 1) = 0;
  *pp_Var7 = (_func_int *)&PTR__ProxyIterator_00b61b60;
  ::Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#1},false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::$_0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::{lambda(auto:1)#2},Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::{lambda(auto:1)#1},Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0,Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_1_,false>,Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::Inferences::ALASCA::EqFactoring::generateClauses(Kernel::Clause*)::__0::TEMPNAMEPLACEHOLDERVALUE(unsigned_long)const::_lambda(auto:1)_2_,Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Clause*>,unsigned_long>(Lib::Stack<Kernel::Clause*>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::Clause*>>,Lib::IterTraits<Lib::Option<Kernel::Clause*>::OptionIter>>>>>>>>
                *)(pp_Var7 + 2),
               (FlatteningIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:169:16),_Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>_>
                *)local_5c0);
  (local_660->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
  super_InferenceEngine._vptr_InferenceEngine = pp_Var7;
  *(int *)(pp_Var7 + 1) = *(int *)(pp_Var7 + 1) + 1;
  ::Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase((OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
                 *)local_580);
  if ((AlascaState *)local_5c0._24_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._24_8_);
  }
  if ((AlascaState *)local_5c0._8_8_ != (AlascaState *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5c0._8_8_);
  }
  ::Lib::
  OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:171:19),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/EqFactoring.cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
  ::~OptionBase(&local_138._current.
                 super_OptionBase<Lib::IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:171:19),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_EqFactoring_cpp:173:20),_Lib::IterTraits<Lib::CoproductIter<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::Option<Kernel::Clause_*>::OptionIter>_>_>_>_>_>_>
               );
  if (local_138._master._func.rest.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138._master._func.rest.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._master._func.selected.
      super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138._master._func.selected.
               super___shared_ptr<Lib::Stack<Kernel::SelectedEquality>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_638 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_638);
  }
  if (local_648 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_648);
  }
  if (local_620 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_620);
  }
  if (local_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_610);
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)local_660;
}

Assistant:

ClauseIterator EqFactoring::generateClauses(Clause* premise) 
{

  TIME_TRACE("alasca equality factoring generate")
  DEBUG("in: ", *premise)

  auto selected = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::NOT_LESS, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  auto rest = Lib::make_shared(
      _shared->selectedEqualities(premise, 
                       /* literal */ SelectionCriterion::ANY, 
                       /* summand */ SelectionCriterion::NOT_LEQ,
                       /* include number vars */ false)
        .filter([](auto& s) { return s.positive(); })
        // .filter([](auto& s) { return !s.isFracNum() || !s.biggerSide().isVar(); })
        .template collect<Stack>());

  return pvi(range(0, selected->size())
      .flatMap([=](auto i) {
        return range(0, rest->size())
          .filter([=](auto j) { return (*selected)[i].litIdx() != (*rest)[j].litIdx(); })
          // .filter([=](auto j) { return (*selected)[i].numTraits() == (*rest)[j].numTraits(); })
          .flatMap([=](auto j) {
              auto& max = (*selected)[i];
              auto& other = (*rest)[j];
              return ifElseIter(

                  // both literals are the same. 
                  // we use a symmetry breaking index comparison
                  // TODO we could replace this == by _shared.equivalent
                  max.literal() == other.literal() && other.litIdx() < max.litIdx(), 
                  [&]() { return arrayIter(Stack<Clause*>{}); },

                  // only one is selected (= maximal)
                  [&]() { return concatIters(applyRule(other, max).intoIter()); });
          });
      }));
}